

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

bool cmSystemTools::RunSingleCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *command,string *captureStdOut,string *captureStdErr,int *retVal,char *dir,
               OutputOption outputflag,cmDuration timeout,Encoding encoding)

{
  pointer pbVar1;
  pointer pcVar2;
  bool bVar3;
  OutputOption OVar4;
  int iVar5;
  cmsysProcess *cp;
  char *pcVar6;
  size_t sVar7;
  long lVar8;
  vector<char,std::allocator<char>> *pvVar9;
  string *cmd;
  pointer pbVar10;
  bool bVar11;
  cmProcessOutput processOutput;
  int length;
  char *data;
  string strdata;
  vector<char,_std::allocator<char>_> tempStdErr;
  vector<char,_std::allocator<char>_> tempStdOut;
  vector<const_char_*,_std::allocator<const_char_*>_> argv;
  cmProcessOutput local_151;
  OutputOption local_150;
  int local_14c;
  char *local_148;
  string local_140;
  string *local_120;
  void *local_118;
  undefined8 uStack_110;
  long local_108;
  void *local_f8;
  undefined8 uStack_f0;
  long local_e8;
  int *local_e0;
  vector<const_char_*,_std::allocator<const_char_*>_> local_d8;
  rep_conflict local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (char **)0x0;
  local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_150 = outputflag;
  local_120 = (string *)dir;
  local_e0 = retVal;
  local_b8 = timeout.__r;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve
            (&local_d8,
             ((long)(command->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(command->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
  pbVar10 = (command->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (command->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar10 != pbVar1) {
    do {
      local_140._M_dataplus._M_p = (pbVar10->_M_dataplus)._M_p;
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_d8,(char **)&local_140);
      pbVar10 = pbVar10 + 1;
    } while (pbVar10 != pbVar1);
  }
  local_140._M_dataplus._M_p = (pointer)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_d8,(char **)&local_140);
  cp = cmsysProcess_New();
  OVar4 = local_150;
  cmsysProcess_SetCommand
            (cp,local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start);
  cmsysProcess_SetWorkingDirectory(cp,(char *)local_120);
  if (s_RunCommandHideConsole == true) {
    cmsysProcess_SetOption(cp,0,1);
  }
  if (OVar4 == OUTPUT_MERGE) {
LAB_0026451d:
    cmsysProcess_SetOption(cp,2,1);
LAB_00264531:
    bVar3 = false;
    captureStdErr = (string *)0x0;
  }
  else {
    if (OVar4 == OUTPUT_PASSTHROUGH) {
      cmsysProcess_SetPipeShared(cp,2,1);
      cmsysProcess_SetPipeShared(cp,3,1);
      captureStdOut = (string *)0x0;
      goto LAB_00264531;
    }
    if (captureStdErr == (string *)0x0) goto LAB_00264531;
    bVar3 = true;
    if (captureStdErr == captureStdOut) goto LAB_0026451d;
  }
  cmsysProcess_SetTimeout(cp,local_b8);
  cmsysProcess_Execute(cp);
  local_f8 = (void *)0x0;
  uStack_f0 = 0;
  local_e8 = 0;
  local_108 = 0;
  local_118 = (void *)0x0;
  uStack_110 = 0;
  cmProcessOutput::cmProcessOutput(&local_151,encoding,0x400);
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  local_140._M_string_length = 0;
  local_140.field_2._M_local_buf[0] = '\0';
  if ((local_150 != OUTPUT_PASSTHROUGH) &&
     (!(bool)(local_150 == OUTPUT_NONE & ~bVar3 & captureStdOut == (string *)0x0))) {
    local_120 = captureStdErr;
LAB_002645cf:
    while (iVar5 = cmsysProcess_WaitForData(cp,&local_148,&local_14c,(double *)0x0),
          captureStdErr = local_120, 0 < iVar5) {
      if (0 < local_14c) {
        lVar8 = 0;
        do {
          if (local_148[lVar8] == '\0') {
            local_148[lVar8] = ' ';
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < local_14c);
      }
      if (iVar5 == 2) goto LAB_0026464f;
      if (iVar5 == 3) {
        if (local_150 != OUTPUT_NONE) {
          cmProcessOutput::DecodeText(&local_151,local_148,(long)local_14c,&local_140,2);
          Stderr(&local_140);
        }
        pvVar9 = (vector<char,std::allocator<char>> *)&local_118;
        if (bVar3) goto LAB_00264687;
      }
    }
    if (local_150 != OUTPUT_NONE) {
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      cmProcessOutput::DecodeText(&local_151,&local_50,&local_140,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                 local_50.field_2._M_local_buf[0]) + 1);
      }
      if (local_140._M_string_length != 0) {
        Stdout(&local_140);
      }
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      cmProcessOutput::DecodeText(&local_151,&local_70,&local_140,2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,
                        CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                 local_70.field_2._M_local_buf[0]) + 1);
      }
      if (local_140._M_string_length != 0) {
        Stderr(&local_140);
      }
    }
  }
  cmsysProcess_WaitForExit(cp,(double *)0x0);
  if (captureStdOut != (string *)0x0) {
    pcVar2 = (captureStdOut->_M_dataplus)._M_p;
    std::__cxx11::string::
    _M_replace_dispatch<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
              ((string *)captureStdOut,pcVar2,pcVar2 + captureStdOut->_M_string_length,local_f8,
               uStack_f0);
    pcVar2 = (captureStdOut->_M_dataplus)._M_p;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar2,pcVar2 + captureStdOut->_M_string_length);
    cmProcessOutput::DecodeText(&local_151,&local_90,captureStdOut,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  if (bVar3) {
    pcVar2 = (captureStdErr->_M_dataplus)._M_p;
    std::__cxx11::string::
    _M_replace_dispatch<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
              ((string *)captureStdErr,pcVar2,pcVar2 + captureStdErr->_M_string_length,local_118,
               uStack_110);
    pcVar2 = (captureStdErr->_M_dataplus)._M_p;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar2,pcVar2 + captureStdErr->_M_string_length);
    cmProcessOutput::DecodeText(&local_151,&local_b0,captureStdErr,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
  }
  iVar5 = cmsysProcess_GetState(cp);
  if (iVar5 == 4) {
    if (local_e0 == (int *)0x0) {
      iVar5 = cmsysProcess_GetExitValue(cp);
      bVar11 = iVar5 == 0;
    }
    else {
      iVar5 = cmsysProcess_GetExitValue(cp);
      *local_e0 = iVar5;
      bVar11 = true;
    }
  }
  else {
    iVar5 = cmsysProcess_GetState(cp);
    if (iVar5 == 2) {
      pcVar6 = cmsysProcess_GetExceptionString(cp);
      if (local_150 != OUTPUT_NONE) {
        if (pcVar6 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x7283b0);
        }
        else {
          sVar7 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar6,sVar7);
        }
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x50);
        std::ostream::put(-0x50);
        std::ostream::flush();
      }
      if (!(bool)(~bVar3 & captureStdOut == (string *)0x0)) {
        if (bVar3) {
          captureStdOut = captureStdErr;
        }
        strlen(pcVar6);
        std::__cxx11::string::append((char *)captureStdOut,(ulong)pcVar6);
      }
    }
    else {
      iVar5 = cmsysProcess_GetState(cp);
      if (iVar5 == 1) {
        pcVar6 = cmsysProcess_GetErrorString(cp);
        if (local_150 != OUTPUT_NONE) {
          if (pcVar6 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x7283b0);
          }
          else {
            sVar7 = strlen(pcVar6);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar6,sVar7);
          }
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x50);
          std::ostream::put(-0x50);
          std::ostream::flush();
        }
        if (!(bool)(~bVar3 & captureStdOut == (string *)0x0)) {
          if (bVar3) {
            captureStdOut = captureStdErr;
          }
          strlen(pcVar6);
          std::__cxx11::string::append((char *)captureStdOut,(ulong)pcVar6);
        }
      }
      else {
        iVar5 = cmsysProcess_GetState(cp);
        bVar11 = true;
        if (iVar5 != 5) goto LAB_00264ad5;
        if (local_150 != OUTPUT_NONE) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Process terminated due to timeout\n",0x22);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x50);
          std::ostream::put(-0x50);
          std::ostream::flush();
        }
        if (bVar3) {
          std::__cxx11::string::append((char *)captureStdErr,0x58faee);
        }
      }
    }
    bVar11 = false;
  }
LAB_00264ad5:
  cmsysProcess_Delete(cp);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,
                    CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                             local_140.field_2._M_local_buf[0]) + 1);
  }
  cmProcessOutput::~cmProcessOutput(&local_151);
  if (local_118 != (void *)0x0) {
    operator_delete(local_118,local_108 - (long)local_118);
  }
  if (local_f8 != (void *)0x0) {
    operator_delete(local_f8,local_e8 - (long)local_f8);
  }
  if (local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (char **)0x0) {
    operator_delete(local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar11;
LAB_0026464f:
  if (local_150 != OUTPUT_NONE) {
    cmProcessOutput::DecodeText(&local_151,local_148,(long)local_14c,&local_140,1);
    Stdout(&local_140);
  }
  pvVar9 = (vector<char,std::allocator<char>> *)&local_f8;
  if (captureStdOut != (string *)0x0) {
LAB_00264687:
    std::vector<char,std::allocator<char>>::_M_range_insert<char*>
              (pvVar9,*(undefined8 *)(pvVar9 + 8));
  }
  goto LAB_002645cf;
}

Assistant:

bool cmSystemTools::RunSingleCommand(std::vector<std::string> const& command,
                                     std::string* captureStdOut,
                                     std::string* captureStdErr, int* retVal,
                                     const char* dir, OutputOption outputflag,
                                     cmDuration timeout, Encoding encoding)
{
  std::vector<const char*> argv;
  argv.reserve(command.size() + 1);
  for (std::string const& cmd : command) {
    argv.push_back(cmd.c_str());
  }
  argv.push_back(nullptr);

  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, argv.data());
  cmsysProcess_SetWorkingDirectory(cp, dir);
  if (cmSystemTools::GetRunCommandHideConsole()) {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
  }

  if (outputflag == OUTPUT_PASSTHROUGH) {
    cmsysProcess_SetPipeShared(cp, cmsysProcess_Pipe_STDOUT, 1);
    cmsysProcess_SetPipeShared(cp, cmsysProcess_Pipe_STDERR, 1);
    captureStdOut = nullptr;
    captureStdErr = nullptr;
  } else if (outputflag == OUTPUT_MERGE ||
             (captureStdErr && captureStdErr == captureStdOut)) {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_MergeOutput, 1);
    captureStdErr = nullptr;
  }
  assert(!captureStdErr || captureStdErr != captureStdOut);

  cmsysProcess_SetTimeout(cp, timeout.count());
  cmsysProcess_Execute(cp);

  std::vector<char> tempStdOut;
  std::vector<char> tempStdErr;
  char* data;
  int length;
  int pipe;
  cmProcessOutput processOutput(encoding);
  std::string strdata;
  if (outputflag != OUTPUT_PASSTHROUGH &&
      (captureStdOut || captureStdErr || outputflag != OUTPUT_NONE)) {
    while ((pipe = cmsysProcess_WaitForData(cp, &data, &length, nullptr)) >
           0) {
      // Translate NULL characters in the output into valid text.
      for (int i = 0; i < length; ++i) {
        if (data[i] == '\0') {
          data[i] = ' ';
        }
      }

      if (pipe == cmsysProcess_Pipe_STDOUT) {
        if (outputflag != OUTPUT_NONE) {
          processOutput.DecodeText(data, length, strdata, 1);
          cmSystemTools::Stdout(strdata);
        }
        if (captureStdOut) {
          cmAppend(tempStdOut, data, data + length);
        }
      } else if (pipe == cmsysProcess_Pipe_STDERR) {
        if (outputflag != OUTPUT_NONE) {
          processOutput.DecodeText(data, length, strdata, 2);
          cmSystemTools::Stderr(strdata);
        }
        if (captureStdErr) {
          cmAppend(tempStdErr, data, data + length);
        }
      }
    }

    if (outputflag != OUTPUT_NONE) {
      processOutput.DecodeText(std::string(), strdata, 1);
      if (!strdata.empty()) {
        cmSystemTools::Stdout(strdata);
      }
      processOutput.DecodeText(std::string(), strdata, 2);
      if (!strdata.empty()) {
        cmSystemTools::Stderr(strdata);
      }
    }
  }

  cmsysProcess_WaitForExit(cp, nullptr);

  if (captureStdOut) {
    captureStdOut->assign(tempStdOut.begin(), tempStdOut.end());
    processOutput.DecodeText(*captureStdOut, *captureStdOut);
  }
  if (captureStdErr) {
    captureStdErr->assign(tempStdErr.begin(), tempStdErr.end());
    processOutput.DecodeText(*captureStdErr, *captureStdErr);
  }

  bool result = true;
  if (cmsysProcess_GetState(cp) == cmsysProcess_State_Exited) {
    if (retVal) {
      *retVal = cmsysProcess_GetExitValue(cp);
    } else {
      if (cmsysProcess_GetExitValue(cp) != 0) {
        result = false;
      }
    }
  } else if (cmsysProcess_GetState(cp) == cmsysProcess_State_Exception) {
    const char* exception_str = cmsysProcess_GetExceptionString(cp);
    if (outputflag != OUTPUT_NONE) {
      std::cerr << exception_str << std::endl;
    }
    if (captureStdErr) {
      captureStdErr->append(exception_str, strlen(exception_str));
    } else if (captureStdOut) {
      captureStdOut->append(exception_str, strlen(exception_str));
    }
    result = false;
  } else if (cmsysProcess_GetState(cp) == cmsysProcess_State_Error) {
    const char* error_str = cmsysProcess_GetErrorString(cp);
    if (outputflag != OUTPUT_NONE) {
      std::cerr << error_str << std::endl;
    }
    if (captureStdErr) {
      captureStdErr->append(error_str, strlen(error_str));
    } else if (captureStdOut) {
      captureStdOut->append(error_str, strlen(error_str));
    }
    result = false;
  } else if (cmsysProcess_GetState(cp) == cmsysProcess_State_Expired) {
    const char* error_str = "Process terminated due to timeout\n";
    if (outputflag != OUTPUT_NONE) {
      std::cerr << error_str << std::endl;
    }
    if (captureStdErr) {
      captureStdErr->append(error_str, strlen(error_str));
    }
    result = false;
  }

  cmsysProcess_Delete(cp);
  return result;
}